

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O3

bool testing::internal::
     TypeParameterizedTest<ParticleArrayTest,_testing::internal::TemplateSel<ParticleArrayTest_IndexAccess_Test>,_testing::internal::Types5<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_>,_pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)3>_>,_pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>_>,_pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>,_pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>_>_>
     ::Register(char *prefix,char *case_name,char *test_names,int index)

{
  char *type_param;
  bool bVar1;
  char *pcVar2;
  TestFactoryBase *factory;
  char *pcVar3;
  size_t __n;
  String local_68;
  char *local_58;
  char *local_50;
  char *local_40 [2];
  
  pcVar3 = "/";
  if (*prefix == '\0') {
    pcVar3 = "";
  }
  local_58 = case_name;
  String::Format((char *)local_40,"%s%s%s/%d",prefix,pcVar3,case_name,(ulong)(uint)index);
  pcVar3 = local_40[0];
  pcVar2 = strchr(test_names,0x2c);
  if (pcVar2 == (char *)0x0) {
    String::String(&local_68,test_names);
  }
  else {
    __n = (long)pcVar2 - (long)test_names;
    pcVar2 = (char *)operator_new__(__n + 1);
    memcpy(pcVar2,test_names,__n);
    pcVar2[__n] = '\0';
    local_68.c_str_ = pcVar2;
    local_68.length_ = __n;
  }
  pcVar2 = local_68.c_str_;
  GetTypeName<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)2>>>();
  type_param = local_50;
  factory = (TestFactoryBase *)operator_new(8);
  factory->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_001f7138;
  MakeAndRegisterTestInfo
            (pcVar3,pcVar2,type_param,(char *)0x0,
             &TypeIdHelper<ParticleArrayTest<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)2>>>>
              ::dummy_,Test::SetUpTestCase,Test::TearDownTestCase,factory);
  if (local_50 != (char *)0x0) {
    operator_delete__(local_50);
  }
  if (local_68.c_str_ != (char *)0x0) {
    operator_delete__(local_68.c_str_);
  }
  if (local_40[0] != (char *)0x0) {
    operator_delete__(local_40[0]);
  }
  bVar1 = TypeParameterizedTest<ParticleArrayTest,_testing::internal::TemplateSel<ParticleArrayTest_IndexAccess_Test>,_testing::internal::Types4<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)3>_>,_pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>_>,_pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>,_pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>_>_>
          ::Register(prefix,local_58,test_names,index + 1);
  return bVar1;
}

Assistant:

static bool Register(const char* prefix, const char* case_name,
                       const char* test_names, int index) {
    typedef typename Types::Head Type;
    typedef Fixture<Type> FixtureClass;
    typedef typename GTEST_BIND_(TestSel, Type) TestClass;

    // First, registers the first type-parameterized test in the type
    // list.
    MakeAndRegisterTestInfo(
        String::Format("%s%s%s/%d", prefix, prefix[0] == '\0' ? "" : "/",
                       case_name, index).c_str(),
        GetPrefixUntilComma(test_names).c_str(),
        GetTypeName<Type>().c_str(),
        NULL,  // No value parameter.
        GetTypeId<FixtureClass>(),
        TestClass::SetUpTestCase,
        TestClass::TearDownTestCase,
        new TestFactoryImpl<TestClass>);

    // Next, recurses (at compile time) with the tail of the type list.
    return TypeParameterizedTest<Fixture, TestSel, typename Types::Tail>
        ::Register(prefix, case_name, test_names, index + 1);
  }